

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# per_decoder.c
# Opt level: O0

asn_dec_rval_t
uper_decode(asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,void **sptr,void *buffer,
           size_t size,int skip_bits,int unused_bits)

{
  int iVar1;
  long in_RCX;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  long *in_RDI;
  long in_R8;
  int in_R9D;
  asn_dec_rval_t aVar2;
  int in_stack_00000008;
  asn_per_data_t pd;
  asn_dec_rval_t rval;
  asn_codec_ctx_t s_codec_ctx;
  asn_dec_rval_t tmp_error;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  undefined4 uStack_94;
  long local_88;
  ulong local_80;
  ulong local_78;
  undefined8 local_70;
  ulong local_58;
  size_t local_50;
  long local_48;
  int local_3c;
  long local_38;
  long local_30;
  undefined8 local_28;
  undefined8 *local_20;
  long *local_18;
  ulong local_10;
  size_t local_8;
  
  if ((((in_R9D < 0) || (7 < in_R9D)) || (in_stack_00000008 < 0)) ||
     ((7 < in_stack_00000008 || ((0 < in_stack_00000008 && (in_R8 == 0)))))) {
    local_10 = CONCAT44(local_10._4_4_,2);
    local_8 = 0;
    if (in_RSI == (undefined8 *)0x0) {
      local_a0 = "";
    }
    else {
      local_a0 = (char *)*in_RSI;
    }
    ASN_DEBUG("Failed to decode element %s",local_a0);
  }
  else {
    local_3c = in_R9D;
    local_38 = in_R8;
    local_30 = in_RCX;
    local_28 = in_RDX;
    local_20 = in_RSI;
    if (in_RDI == (long *)0x0) {
      memset(&local_48,0,8);
      local_48 = 30000;
      local_18 = &local_48;
    }
    else {
      local_18 = in_RDI;
      if (*in_RDI != 0) {
        local_48 = *in_RDI;
        local_18 = &local_48;
      }
    }
    memset(&local_88,0,0x30);
    local_88 = local_30;
    local_80 = (ulong)local_3c;
    local_78 = local_38 * 8 - (long)in_stack_00000008;
    if (local_78 < local_80) {
      local_10 = CONCAT44(local_10._4_4_,2);
      local_8 = 0;
      if (local_20 == (undefined8 *)0x0) {
        local_a8 = "";
      }
      else {
        local_a8 = (char *)*local_20;
      }
      ASN_DEBUG("Failed to decode element %s",local_a8);
    }
    else if (local_20[9] == 0) {
      local_10 = CONCAT44(local_10._4_4_,2);
      local_8 = 0;
      if (local_20 == (undefined8 *)0x0) {
        local_b0 = "";
      }
      else {
        local_b0 = (char *)*local_20;
      }
      ASN_DEBUG("Failed to decode element %s",local_b0);
    }
    else {
      iVar1 = (*(code *)local_20[9])(local_18,local_20,0,local_28,&local_88);
      local_58 = CONCAT44(uStack_94,iVar1);
      if (iVar1 == 0) {
        local_50 = ((local_88 - local_30) * 8 + local_80) - (long)local_3c;
        ASN_DEBUG("PER decoding consumed %ld, counted %ld",local_50,local_70);
      }
      else {
        local_50 = 0;
      }
      local_10 = local_58;
      local_8 = local_50;
    }
  }
  aVar2._0_8_ = local_10 & 0xffffffff;
  aVar2.consumed = local_8;
  return aVar2;
}

Assistant:

asn_dec_rval_t
uper_decode(asn_codec_ctx_t *opt_codec_ctx, asn_TYPE_descriptor_t *td, void **sptr, const void *buffer, size_t size, int skip_bits, int unused_bits) {
	asn_codec_ctx_t s_codec_ctx;
	asn_dec_rval_t rval;
	asn_per_data_t pd;

	if(skip_bits < 0 || skip_bits > 7
	|| unused_bits < 0 || unused_bits > 7
	|| (unused_bits > 0 && !size))
		ASN__DECODE_FAILED;

	/*
	 * Stack checker requires that the codec context
	 * must be allocated on the stack.
	 */
	if(opt_codec_ctx) {
		if(opt_codec_ctx->max_stack_size) {
			s_codec_ctx = *opt_codec_ctx;
			opt_codec_ctx = &s_codec_ctx;
		}
	} else {
		/* If context is not given, be security-conscious anyway */
		memset(&s_codec_ctx, 0, sizeof(s_codec_ctx));
		s_codec_ctx.max_stack_size = ASN__DEFAULT_STACK_MAX;
		opt_codec_ctx = &s_codec_ctx;
	}

	/* Fill in the position indicator */
	memset(&pd, 0, sizeof(pd));
	pd.buffer = (const uint8_t *)buffer;
	pd.nboff = skip_bits;
	pd.nbits = 8 * size - unused_bits; /* 8 is CHAR_BIT from <limits.h> */
	if(pd.nboff > pd.nbits)
		ASN__DECODE_FAILED;

	/*
	 * Invoke type-specific decoder.
	 */
	if(!td->uper_decoder)
		ASN__DECODE_FAILED;	/* PER is not compiled in */
	rval = td->uper_decoder(opt_codec_ctx, td, 0, sptr, &pd);
	if(rval.code == RC_OK) {
		/* Return the number of consumed bits */
		rval.consumed = ((pd.buffer - (const uint8_t *)buffer) << 3)
					+ pd.nboff - skip_bits;
		ASN_DEBUG("PER decoding consumed %ld, counted %ld",
			(long)rval.consumed, (long)pd.moved);
		assert(rval.consumed == pd.moved);
	} else {
		/* PER codec is not a restartable */
		rval.consumed = 0;
	}
	return rval;
}